

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O1

void __thiscall HDual::an_iz_vr_v(HDual *this)

{
  return;
}

Assistant:

void HDual::an_iz_vr_v() {
  double norm_bc_pr_vr = 0;
  double norm_bc_du_vr = 0;
  for (int r_n = 0; r_n < numRow; r_n++) {
    int vr_n = model->getBaseIndex()[r_n];
    norm_bc_pr_vr += baseValue[r_n]*baseValue[r_n];
    norm_bc_du_vr += workDual[vr_n]*workDual[vr_n];
  }
  double norm_nonbc_pr_vr = 0;
  double norm_nonbc_du_vr = 0;
  for (int vr_n = 0; vr_n < numTot; vr_n++) {
    if (model->getNonbasicFlag()[vr_n]) {
      double pr_act_v = model->getWorkValue()[vr_n];
      norm_nonbc_pr_vr += pr_act_v*pr_act_v;
      norm_nonbc_du_vr += workDual[vr_n]*workDual[vr_n];
    }
  }
  //printf("Initial point has %d dual infeasibilities\n", dualInfeasCount);
  //printf("Norm of the basic    primal activites is %g\n", sqrt(norm_bc_pr_vr));
  //printf("Norm of the basic    dual   activites is %g\n", sqrt(norm_bc_du_vr));
  //printf("Norm of the nonbasic primal activites is %g\n", sqrt(norm_nonbc_pr_vr));
  //printf("Norm of the nonbasic dual   activites is %g\n", sqrt(norm_nonbc_du_vr));
}